

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O2

bool __thiscall
benchmark::internal::BenchmarkFamilies::FindBenchmarks
          (BenchmarkFamilies *this,string *spec,
          vector<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
          *benchmarks)

{
  uint uVar1;
  int iVar2;
  pointer puVar3;
  Benchmark *pBVar4;
  BenchmarkImp *pBVar5;
  pointer ppVar6;
  bool bVar7;
  bool bVar8;
  pointer puVar9;
  ostream *poVar10;
  uint *puVar11;
  pointer ppVar12;
  Instance instance;
  vector<int,_std::allocator<int>_> one_thread;
  MutexLock l;
  string error_msg;
  Regex re;
  uint *local_138;
  value_type local_118;
  _Vector_base<int,_std::allocator<int>_> local_c8;
  unique_lock<std::mutex> local_a8;
  string local_98;
  string local_78;
  Regex local_58;
  
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_98._M_string_length = 0;
  local_98.field_2._M_local_buf[0] = '\0';
  Regex::Regex(&local_58);
  bVar7 = Regex::Init(&local_58,spec,&local_98);
  if (bVar7) {
    local_c8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_118.name._M_dataplus._M_p._0_4_ = 1;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              ((vector<int,_std::allocator<int>_> *)&local_c8,(int *)&local_118);
    std::unique_lock<std::mutex>::unique_lock(&local_a8,&(this->mutex_).mut_);
    puVar3 = (this->families_).
             super__Vector_base<std::unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>,_std::allocator<std::unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar9 = (this->families_).
                  super__Vector_base<std::unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>,_std::allocator<std::unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar9 != puVar3; puVar9 = puVar9 + 1)
    {
      pBVar4 = (puVar9->_M_t).
               super___uniq_ptr_impl<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>
               ._M_t.
               super__Tuple_impl<0UL,_benchmark::internal::Benchmark_*,_std::default_delete<benchmark::internal::Benchmark>_>
               .super__Head_base<0UL,_benchmark::internal::Benchmark_*,_false>._M_head_impl;
      if (pBVar4 != (Benchmark *)0x0) {
        pBVar5 = pBVar4->imp_;
        if (pBVar5->arg_count_ == -1) {
          pBVar5->arg_count_ = 0;
          local_118.name._M_dataplus._M_p._0_4_ = 0xffffffff;
          local_78._M_dataplus._M_p._0_4_ = 0xffffffff;
          std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int,int>
                    ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&pBVar5->args_
                     ,(int *)&local_118,(int *)&local_78);
        }
        ppVar6 = *(pointer *)
                  ((long)&(pBVar5->args_).
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                  + 8);
        for (ppVar12 = *(pointer *)
                        &(pBVar5->args_).
                         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                         ._M_impl; ppVar12 != ppVar6; ppVar12 = ppVar12 + 1) {
          puVar11 = *(uint **)&(pBVar5->thread_counts_).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl;
          local_138 = *(uint **)((long)&(pBVar5->thread_counts_).
                                        super__Vector_base<int,_std::allocator<int>_> + 8);
          if (puVar11 == local_138) {
            local_138 = (uint *)local_c8._M_impl.super__Vector_impl_data._M_finish;
            puVar11 = (uint *)local_c8._M_impl.super__Vector_impl_data._M_start;
          }
          for (; puVar11 != local_138; puVar11 = puVar11 + 1) {
            uVar1 = *puVar11;
            local_118.name._M_dataplus._M_p = (pointer)&local_118.name.field_2;
            local_118.name._M_string_length = 0;
            local_118.name.field_2._M_local_buf[0] = '\0';
            std::__cxx11::string::_M_assign((string *)&local_118);
            local_118.benchmark =
                 (puVar9->_M_t).
                 super___uniq_ptr_impl<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_benchmark::internal::Benchmark_*,_std::default_delete<benchmark::internal::Benchmark>_>
                 .super__Head_base<0UL,_benchmark::internal::Benchmark_*,_false>._M_head_impl;
            iVar2 = pBVar5->arg_count_;
            local_118.has_arg1 = 0 < iVar2;
            local_118.arg1 = ppVar12->first;
            local_118.has_arg2 = iVar2 == 2;
            local_118.arg2 = ppVar12->second;
            local_118.min_time = pBVar5->min_time_;
            local_118.use_real_time = pBVar5->use_real_time_;
            local_118.multithreaded =
                 *(pointer *)
                  &(pBVar5->thread_counts_).super__Vector_base<int,_std::allocator<int>_>._M_impl !=
                 *(pointer *)
                  ((long)&(pBVar5->thread_counts_).super__Vector_base<int,_std::allocator<int>_> + 8
                  );
            local_118.threads = uVar1;
            if (0 < iVar2) {
              AppendHumanReadable(local_118.arg1,&local_118.name);
              if (1 < pBVar5->arg_count_) {
                AppendHumanReadable(local_118.arg2,&local_118.name);
              }
            }
            if (2.220446049250313e-16 <= ABS(pBVar5->min_time_)) {
              StringPrintF_abi_cxx11_(&local_78,"/min_time:%0.3f");
              std::__cxx11::string::append((string *)&local_118);
              std::__cxx11::string::~string((string *)&local_78);
            }
            if (pBVar5->use_real_time_ == true) {
              std::__cxx11::string::append((char *)&local_118);
            }
            if (*(pointer *)
                 &(pBVar5->thread_counts_).super__Vector_base<int,_std::allocator<int>_>._M_impl !=
                *(pointer *)
                 ((long)&(pBVar5->thread_counts_).super__Vector_base<int,_std::allocator<int>_> + 8)
               ) {
              StringPrintF_abi_cxx11_(&local_78,"/threads:%d",(ulong)(uint)local_118.threads);
              std::__cxx11::string::append((string *)&local_118);
              std::__cxx11::string::~string((string *)&local_78);
            }
            bVar8 = Regex::Match(&local_58,&local_118.name);
            if (bVar8) {
              std::
              vector<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
              ::push_back(benchmarks,&local_118);
            }
            std::__cxx11::string::~string((string *)&local_118);
          }
        }
      }
    }
    std::unique_lock<std::mutex>::~unique_lock(&local_a8);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_c8);
  }
  else {
    poVar10 = std::operator<<((ostream *)&std::cerr,"Could not compile benchmark re: ");
    poVar10 = std::operator<<(poVar10,(string *)&local_98);
    std::endl<char,std::char_traits<char>>(poVar10);
  }
  Regex::~Regex(&local_58);
  std::__cxx11::string::~string((string *)&local_98);
  return bVar7;
}

Assistant:

bool BenchmarkFamilies::FindBenchmarks(
    const std::string& spec,
    std::vector<Benchmark::Instance>* benchmarks) {
  // Make regular expression out of command-line flag
  std::string error_msg;
  Regex re;
  if (!re.Init(spec, &error_msg)) {
    std::cerr << "Could not compile benchmark re: " << error_msg << std::endl;
    return false;
  }

  // Special list of thread counts to use when none are specified
  std::vector<int> one_thread;
  one_thread.push_back(1);

  MutexLock l(mutex_);
  for (std::unique_ptr<Benchmark>& bench_family : families_) {
    // Family was deleted or benchmark doesn't match
    if (!bench_family) continue;
    BenchmarkImp* family = bench_family->imp_;

    if (family->arg_count_ == -1) {
      family->arg_count_ = 0;
      family->args_.emplace_back(-1, -1);
    }
    for (auto const& args : family->args_) {
      const std::vector<int>* thread_counts =
        (family->thread_counts_.empty()
         ? &one_thread
         : &family->thread_counts_);
      for (int num_threads : *thread_counts) {

        Benchmark::Instance instance;
        instance.name = family->name_;
        instance.benchmark = bench_family.get();
        instance.has_arg1 = family->arg_count_ >= 1;
        instance.arg1 = args.first;
        instance.has_arg2 = family->arg_count_ == 2;
        instance.arg2 = args.second;
        instance.min_time = family->min_time_;
        instance.use_real_time = family->use_real_time_;
        instance.threads = num_threads;
        instance.multithreaded = !(family->thread_counts_.empty());

        // Add arguments to instance name
        if (family->arg_count_ >= 1) {
          AppendHumanReadable(instance.arg1, &instance.name);
        }
        if (family->arg_count_ >= 2) {
          AppendHumanReadable(instance.arg2, &instance.name);
        }
        if (!IsZero(family->min_time_)) {
          instance.name +=  StringPrintF("/min_time:%0.3f",  family->min_time_);
        }
        if (family->use_real_time_) {
          instance.name +=  "/real_time";
        }

        // Add the number of threads used to the name
        if (!family->thread_counts_.empty()) {
          instance.name += StringPrintF("/threads:%d", instance.threads);
        }

        if (re.Match(instance.name)) {
          benchmarks->push_back(instance);
        }
      }
    }
  }
  return true;
}